

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_check_deviate_unique(lys_module *module,lys_deviate *deviate,lys_node *dev_target)

{
  char **value;
  int iVar1;
  lys_unique *local_48;
  lys_unique *last_unique;
  uint i;
  char *str;
  lys_node_list *list;
  lys_node *dev_target_local;
  lys_deviate *deviate_local;
  lys_module *module_local;
  
  last_unique._4_4_ = 0;
  local_48 = (lys_unique *)0x0;
  iVar1 = yang_read_deviate_unique(deviate,dev_target);
  if (iVar1 == 0) {
    local_48 = (lys_unique *)(dev_target[1].ext + (ulong)dev_target->padding[3] * 2);
    for (last_unique._4_4_ = 0; last_unique._4_4_ < deviate->unique_size;
        last_unique._4_4_ = last_unique._4_4_ + 1) {
      value = deviate->unique[last_unique._4_4_].expr;
      if (deviate->mod == LY_DEVIATE_ADD) {
        iVar1 = yang_fill_unique(module,(lys_node_list *)dev_target,
                                 (lys_unique *)
                                 (dev_target[1].ext + (ulong)dev_target->padding[3] * 2),
                                 (char *)value,(unres_schema *)0x0);
        if (iVar1 != 0) {
          free(value);
          goto LAB_0017120d;
        }
        dev_target->padding[3] = dev_target->padding[3] + '\x01';
      }
      else if (deviate->mod == LY_DEVIATE_DEL) {
        iVar1 = yang_fill_unique(module,(lys_node_list *)dev_target,
                                 deviate->unique + last_unique._4_4_,(char *)value,
                                 (unres_schema *)0x0);
        if (iVar1 != 0) {
          free(value);
          goto LAB_0017120d;
        }
        iVar1 = yang_deviate_delete_unique
                          (module,deviate,(lys_node_list *)dev_target,last_unique._4_4_,
                           (char *)value);
        if (iVar1 != 0) {
          free(value);
          goto LAB_0017120d;
        }
      }
      free(value);
    }
    if (deviate->mod == LY_DEVIATE_ADD) {
      free(deviate->unique);
      deviate->unique = local_48;
    }
    module_local._4_4_ = 0;
  }
  else {
LAB_0017120d:
    if (deviate->mod == LY_DEVIATE_ADD) {
      while (last_unique._4_4_ = last_unique._4_4_ + 1, last_unique._4_4_ < deviate->unique_size) {
        free(deviate->unique[last_unique._4_4_].expr);
      }
      free(deviate->unique);
      deviate->unique = local_48;
    }
    module_local._4_4_ = 1;
  }
  return module_local._4_4_;
}

Assistant:

int yang_check_deviate_unique(struct lys_module *module, struct lys_deviate *deviate, struct lys_node *dev_target)
{
    struct lys_node_list *list;
    char *str;
    uint i = 0;
    struct lys_unique *last_unique = NULL;

    if (yang_read_deviate_unique(deviate, dev_target)) {
        goto error;
    }
    list = (struct lys_node_list *)dev_target;
    last_unique = &list->unique[list->unique_size];
    for (i = 0; i < deviate->unique_size; ++i) {
        str = (char *) deviate->unique[i].expr;
        if (deviate->mod == LY_DEVIATE_ADD) {
            if (yang_fill_unique(module, list, &list->unique[list->unique_size], str, NULL)) {
                free(str);
                goto error;
            }
            list->unique_size++;
        } else if (deviate->mod == LY_DEVIATE_DEL) {
            if (yang_fill_unique(module, list, &deviate->unique[i], str, NULL)) {
                free(str);
                goto error;
            }
            if (yang_deviate_delete_unique(module, deviate, list, i, str)) {
                free(str);
                goto error;
            }
        }
        free(str);
    }
    if (deviate->mod == LY_DEVIATE_ADD) {
        free(deviate->unique);
        deviate->unique = last_unique;
    }


    return EXIT_SUCCESS;
error:
    if (deviate->mod == LY_DEVIATE_ADD) {
        for (i = i + 1; i < deviate->unique_size; ++i) {
            free(deviate->unique[i].expr);
        }
        free(deviate->unique);
        deviate->unique = last_unique;

    }
    return EXIT_FAILURE;
}